

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fxrstor_x86_64(CPUX86State *env,target_ulong ptr)

{
  uintptr_t unaff_retaddr;
  uintptr_t ra;
  target_ulong ptr_local;
  CPUX86State *env_local;
  
  if ((ptr & 0xf) == 0) {
    do_xrstor_fpu(env,ptr,unaff_retaddr);
    if (((env->cr[4] & 0x200) != 0) &&
       (((do_xrstor_mxcsr(env,ptr,unaff_retaddr), (env->efer & 0x4000) == 0 ||
         ((env->hflags & 3) != 0)) || ((env->hflags & 0x4000) == 0)))) {
      do_xrstor_sse(env,ptr,unaff_retaddr);
    }
    return;
  }
  raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
}

Assistant:

void helper_fxrstor(CPUX86State *env, target_ulong ptr)
{
    uintptr_t ra = GETPC();

    /* The operand must be 16 byte aligned */
    if (ptr & 0xf) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    do_xrstor_fpu(env, ptr, ra);

    if (env->cr[4] & CR4_OSFXSR_MASK) {
        do_xrstor_mxcsr(env, ptr, ra);
        /* Fast FXRSTOR leaves out the XMM registers */
        if (!(env->efer & MSR_EFER_FFXSR)
            || (env->hflags & HF_CPL_MASK)
            || !(env->hflags & HF_LMA_MASK)) {
            do_xrstor_sse(env, ptr, ra);
        }
    }
}